

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O0

void SS_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  int iVar1;
  uint64_t tmp_1;
  int remain;
  uint64_t tmp;
  unsigned_long_long new_key;
  int j;
  int i;
  int nbytes_local;
  uchar *ret_key_local;
  uchar *key_local;
  
  for (j = 0; j < nbytes / 4; j = j + 1) {
    new_key = 0;
    for (i = 0; i < 4; i = i + 1) {
      new_key = (ulong)key[(3 - i) + j * 4] << ((byte)(i << 3) & 0x3f) | new_key;
    }
    for (i = 0; i < 4; i = i + 1) {
      ret_key[i + j * 4] = (uchar)(new_key * 0x7c32b16d >> ((byte)(i << 3) & 0x3f));
    }
  }
  iVar1 = nbytes % 4;
  new_key = 0;
  for (i = 0; i < iVar1; i = i + 1) {
    new_key = (ulong)key[(iVar1 - i) + -1 + j * 4] << ((byte)(i << 3) & 0x3f) | new_key;
  }
  for (i = 0; i < iVar1; i = i + 1) {
    ret_key[i + j * 4] = (uchar)(new_key * 0x7c32b16d >> ((byte)(i << 3) & 0x3f));
  }
  return;
}

Assistant:

void SS_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	int i, j;
	unsigned long long new_key;
	for (j = 0; j < nbytes / 4; ++j) {
		new_key = 0;
		for (i = 0; i < 4; ++i) {
			uint64_t tmp = 0;
			tmp = key[4 - i - 1 + j * 4];
			new_key |= tmp << (i * 8);
		}
		new_key = (new_key * 2083697005) & (0xffffffffffffffff);
		for (i = 0; i < 4; ++i) {
			ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
		}
	}

	int remain = nbytes % 4;
	new_key = 0;
	for (i = 0; i < remain; ++i) {
		uint64_t tmp = 0;
		tmp = key[remain - i - 1 + j * 4];
		new_key |= tmp << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffffffffffff);
	for (i = 0; i < remain; ++i) {
		ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
	}
}